

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_map.hpp
# Opt level: O0

void __thiscall
cappuccino::
ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
::do_insert(ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
            *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,bool *value
           ,time_point expire_time)

{
  iterator __x;
  _List_iterator<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element>
  _Var1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>_>,_bool>
  pVar3;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>_>
  local_40;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>_>
  keyed_position;
  keyed_element element;
  bool *value_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_local;
  ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
  *this_local;
  time_point expire_time_local;
  
  this_local = (ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>
                *)expire_time.__d.__r;
  keyed_element::keyed_element((keyed_element *)&keyed_position);
  keyed_position._M_node._0_1_ = *value & 1;
  pVar3 = std::
          map<std::__cxx11::string,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>>>
          ::
          emplace<std::__cxx11::string_const&,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>
                    ((map<std::__cxx11::string,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>>>
                      *)&this->m_keyed_elements,key,(keyed_element *)&keyed_position);
  local_40 = pVar3.first._M_node;
  std::__cxx11::
  list<cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::ttl_element,std::allocator<cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::ttl_element>>
  ::
  emplace_back<std::chrono::time_point<std::chrono::_V2::steady_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&,std::_Rb_tree_iterator<std::pair<std::__cxx11::string_const,cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::keyed_element>>&>
            ((list<cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::ttl_element,std::allocator<cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::ttl_element>>
              *)&this->m_ttl_list,
             (time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              *)&this_local,&local_40);
  __x = std::__cxx11::
        list<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element,_std::allocator<cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::ttl_element>_>
        ::end(&this->m_ttl_list);
  _Var1 = std::
          prev<std::_List_iterator<cappuccino::ut_map<std::__cxx11::string,bool,(cappuccino::thread_safe)1>::ttl_element>>
                    (__x._M_node,1);
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cappuccino::ut_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_(cappuccino::thread_safe)1>::keyed_element>_>
           ::operator->(&local_40);
  (ppVar2->second).m_ttl_position._M_node = _Var1._M_node;
  return;
}

Assistant:

auto do_insert(const key_type& key, value_type&& value, std::chrono::steady_clock::time_point expire_time) -> void
    {
        keyed_element element;
        element.m_value = std::move(value);

        auto keyed_position = m_keyed_elements.emplace(key, std::move(element)).first;

        m_ttl_list.emplace_back(expire_time, keyed_position);

        // Update the elements iterator to ttl_element.
        keyed_position->second.m_ttl_position = std::prev(m_ttl_list.end());
    }